

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unicodeNext(sqlite3_tokenizer_cursor *pC,char **paToken,int *pnToken,int *piStart,int *piEnd,
               int *piPos)

{
  unicode_tokenizer *p;
  uint uVar1;
  int iVar2;
  sqlite3_tokenizer *psVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  sqlite3_tokenizer *psVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte bVar14;
  ulong uVar15;
  
  iVar2 = *(int *)((long)&pC[2].pTokenizer + 4);
  if (iVar2 < *(int *)&pC[2].pTokenizer) {
    p = (unicode_tokenizer *)pC->pTokenizer;
    pbVar12 = (byte *)((long)&(pC[1].pTokenizer)->pModule + (long)*(int *)&pC[2].pTokenizer);
    pbVar13 = (byte *)((long)&(pC[1].pTokenizer)->pModule + (long)iVar2);
    do {
      pbVar6 = pbVar13 + 1;
      bVar14 = *pbVar13;
      uVar15 = (ulong)bVar14;
      pbVar7 = pbVar6;
      if (0xbf < bVar14) {
        uVar1 = (uint)""[bVar14 - 0xc0];
        for (; (pbVar7 = pbVar12, pbVar6 != pbVar12 &&
               (pbVar7 = pbVar6, (*pbVar6 & 0xffffffc0) == 0x80)); pbVar6 = pbVar6 + 1) {
          uVar1 = *pbVar6 & 0x3f | uVar1 << 6;
        }
        uVar15 = (ulong)uVar1;
        if ((uVar1 & 0xfffff800) == 0xd800) {
          uVar15 = 0xfffd;
        }
        if (uVar1 < 0x80) {
          uVar15 = 0xfffd;
        }
        if ((uVar1 & 0xfffffffe) == 0xfffe) {
          uVar15 = 0xfffd;
        }
      }
      iVar2 = unicodeIsAlnum(p,(int)uVar15);
      if (iVar2 != 0) {
        psVar11 = pC[4].pTokenizer;
        psVar3 = psVar11;
        goto LAB_001c8625;
      }
      pbVar13 = pbVar7;
    } while (pbVar7 < pbVar12);
  }
  return 0x65;
LAB_001c8625:
  iVar2 = *(int *)&pC[5].pTokenizer;
  if ((long)iVar2 + -4 <= (long)psVar11 - (long)psVar3) {
    iVar9 = sqlite3_initialize();
    if (iVar9 != 0) {
      return 7;
    }
    psVar3 = (sqlite3_tokenizer *)sqlite3Realloc(psVar3,(long)iVar2 + 0x40);
    if (psVar3 == (sqlite3_tokenizer *)0x0) {
      return 7;
    }
    psVar11 = (sqlite3_tokenizer *)(((long)psVar11 - (long)pC[4].pTokenizer) + (long)psVar3);
    pC[4].pTokenizer = psVar3;
    *(int *)&pC[5].pTokenizer = *(int *)&pC[5].pTokenizer + 0x40;
  }
  uVar1 = (uint)uVar15;
  if ((int)uVar1 < 0x80) {
    if (uVar1 - 0x41 < 0x1a) {
      uVar15 = (ulong)(uVar1 | 0x20);
LAB_001c87c2:
      uVar1 = (uint)uVar15;
      bVar14 = (byte)uVar15;
      if ((int)uVar1 < 0x80) {
        *(byte *)&psVar11->pModule = bVar14;
        psVar11 = (sqlite3_tokenizer *)((long)&psVar11->pModule + 1);
      }
      else if (uVar1 < 0x800) {
        *(byte *)&psVar11->pModule = (byte)(uVar15 >> 6) | 0xc0;
        *(byte *)((long)&psVar11->pModule + 1) = bVar14 & 0x3f | 0x80;
        psVar11 = (sqlite3_tokenizer *)((long)&psVar11->pModule + 2);
      }
      else {
        if (0xffff < uVar1) goto LAB_001c8847;
        *(byte *)&psVar11->pModule = (byte)(uVar15 >> 0xc) | 0xe0;
        *(byte *)((long)&psVar11->pModule + 1) = (byte)(uVar15 >> 6) & 0x3f | 0x80;
        *(byte *)((long)&psVar11->pModule + 2) = bVar14 & 0x3f | 0x80;
        psVar11 = (sqlite3_tokenizer *)((long)&psVar11->pModule + 3);
      }
    }
    else {
LAB_001c87b9:
      if ((int)uVar15 != 0) goto LAB_001c87c2;
    }
  }
  else {
    if (uVar1 < 0x10000) {
      iVar2 = 0;
      iVar9 = -1;
      iVar10 = 0xa2;
      do {
        iVar8 = (iVar2 + iVar10) / 2;
        if ((int)uVar1 < (int)(uint)*(ushort *)(sqlite3FtsUnicodeFold_aEntry + (long)iVar8 * 4)) {
          iVar10 = iVar8 + -1;
        }
        else {
          iVar2 = iVar8 + 1;
          iVar9 = iVar8;
        }
      } while (iVar2 <= iVar10);
      lVar5 = (long)iVar9;
      if (((int)uVar1 <
           (int)((uint)(byte)sqlite3FtsUnicodeFold_aEntry[lVar5 * 4 + 3] +
                (uint)*(ushort *)(sqlite3FtsUnicodeFold_aEntry + lVar5 * 4))) &&
         (((*(ushort *)(sqlite3FtsUnicodeFold_aEntry + lVar5 * 4) ^ uVar1) &
           (uint)(byte)sqlite3FtsUnicodeFold_aEntry[lVar5 * 4 + 2] & 1) == 0)) {
        uVar15 = (ulong)(ushort)((short)uVar15 +
                                *(short *)((long)sqlite3Fts5UnicodeFold::aiOff +
                                          (ulong)((byte)sqlite3FtsUnicodeFold_aEntry[lVar5 * 4 + 2]
                                                 & 0xfffffffe)));
      }
      if (p->eRemoveDiacritic != 0) {
        iVar10 = 0x7d;
        iVar2 = 0;
        iVar9 = 0;
        do {
          iVar8 = (iVar10 + iVar2) / 2;
          if ((int)uVar15 * 8 + 7U < (uint)*(ushort *)(&DAT_00206010 + (long)iVar8 * 2)) {
            iVar10 = iVar8 + -1;
          }
          else {
            iVar2 = iVar8 + 1;
            iVar9 = iVar8;
          }
        } while (iVar2 <= iVar10);
        lVar5 = (long)iVar9;
        if ((p->eRemoveDiacritic == 2) || (-1 < (char)(&DAT_00206110)[lVar5])) {
          if ((int)((*(ushort *)(&DAT_00206010 + lVar5 * 2) & 7) +
                   (uint)(*(ushort *)(&DAT_00206010 + lVar5 * 2) >> 3)) < (int)uVar15)
          goto LAB_001c87c2;
          uVar15 = (ulong)((byte)(&DAT_00206110)[lVar5] & 0x7f);
        }
      }
      goto LAB_001c87b9;
    }
    uVar4 = uVar1 + 0x28;
    if (0x27 < uVar1 - 0x10400) {
      uVar4 = uVar1;
    }
    uVar15 = (ulong)uVar4;
LAB_001c8847:
    *(uint *)&psVar11->pModule =
         ((uint)uVar15 << 0x18 |
         ((uint)uVar15 & 0x3fc0) << 10 |
         (uint)(uVar15 >> 0x12) & 0xff | (uint)(uVar15 >> 4) & 0xff00) & (uint)DAT_00206450 |
         (uint)DAT_00206460;
    psVar11 = (sqlite3_tokenizer *)((long)&psVar11->pModule + 4);
  }
  pbVar6 = pbVar7;
  if (pbVar12 <= pbVar7) goto LAB_001c8974;
  pbVar6 = pbVar7 + 1;
  bVar14 = *pbVar7;
  uVar15 = (ulong)bVar14;
  if (0xbf < bVar14) {
    uVar1 = (uint)""[bVar14 - 0xc0];
    for (; (pbVar6 != pbVar12 && ((*pbVar6 & 0xffffffc0) == 0x80)); pbVar6 = pbVar6 + 1) {
      uVar1 = uVar1 << 6 | *pbVar6 & 0x3f;
    }
    uVar15 = (ulong)uVar1;
    if ((uVar1 & 0xfffff800) == 0xd800) {
      uVar15 = 0xfffd;
    }
    if (uVar1 < 0x80) {
      uVar15 = 0xfffd;
    }
    if ((uVar1 & 0xfffffffe) == 0xfffe) {
      uVar15 = 0xfffd;
    }
  }
  uVar1 = (uint)uVar15;
  iVar2 = unicodeIsAlnum(p,uVar1);
  if (iVar2 == 0) {
    if (uVar1 - 0x332 < 0xffffffce) {
LAB_001c8974:
      *(int *)((long)&pC[2].pTokenizer + 4) = (int)pbVar6 - *(int *)&pC[1].pTokenizer;
      psVar3 = pC[4].pTokenizer;
      *paToken = (char *)psVar3;
      *pnToken = (int)psVar11 - (int)psVar3;
      iVar2 = *(int *)&pC[1].pTokenizer;
      *piStart = (int)pbVar13 - iVar2;
      *piEnd = (int)pbVar7 - iVar2;
      iVar2 = *(int *)&pC[3].pTokenizer;
      *(int *)&pC[3].pTokenizer = iVar2 + 1;
      *piPos = iVar2;
      return 0;
    }
    uVar4 = 0x361f8;
    if (uVar1 < 800) {
      uVar4 = 0x8029fdf;
    }
    if ((uVar4 >> (uVar1 - 0x20 & 0x1f) & 1) == 0) goto LAB_001c8974;
  }
  psVar3 = pC[4].pTokenizer;
  pbVar7 = pbVar6;
  goto LAB_001c8625;
}

Assistant:

static int unicodeNext(
  sqlite3_tokenizer_cursor *pC,   /* Cursor returned by simpleOpen */
  const char **paToken,           /* OUT: Token text */
  int *pnToken,                   /* OUT: Number of bytes at *paToken */
  int *piStart,                   /* OUT: Starting offset of token */
  int *piEnd,                     /* OUT: Ending offset of token */
  int *piPos                      /* OUT: Position integer of token */
){
  unicode_cursor *pCsr = (unicode_cursor *)pC;
  unicode_tokenizer *p = ((unicode_tokenizer *)pCsr->base.pTokenizer);
  unsigned int iCode = 0;
  char *zOut;
  const unsigned char *z = &pCsr->aInput[pCsr->iOff];
  const unsigned char *zStart = z;
  const unsigned char *zEnd;
  const unsigned char *zTerm = &pCsr->aInput[pCsr->nInput];

  /* Scan past any delimiter characters before the start of the next token.
  ** Return SQLITE_DONE early if this takes us all the way to the end of 
  ** the input.  */
  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    if( unicodeIsAlnum(p, (int)iCode) ) break;
    zStart = z;
  }
  if( zStart>=zTerm ) return SQLITE_DONE;

  zOut = pCsr->zToken;
  do {
    int iOut;

    /* Grow the output buffer if required. */
    if( (zOut-pCsr->zToken)>=(pCsr->nAlloc-4) ){
      char *zNew = sqlite3_realloc64(pCsr->zToken, pCsr->nAlloc+64);
      if( !zNew ) return SQLITE_NOMEM;
      zOut = &zNew[zOut - pCsr->zToken];
      pCsr->zToken = zNew;
      pCsr->nAlloc += 64;
    }

    /* Write the folded case of the last character read to the output */
    zEnd = z;
    iOut = sqlite3FtsUnicodeFold((int)iCode, p->eRemoveDiacritic);
    if( iOut ){
      WRITE_UTF8(zOut, iOut);
    }

    /* If the cursor is not at EOF, read the next character */
    if( z>=zTerm ) break;
    READ_UTF8(z, zTerm, iCode);
  }while( unicodeIsAlnum(p, (int)iCode) 
       || sqlite3FtsUnicodeIsdiacritic((int)iCode)
  );

  /* Set the output variables and return. */
  pCsr->iOff = (int)(z - pCsr->aInput);
  *paToken = pCsr->zToken;
  *pnToken = (int)(zOut - pCsr->zToken);
  *piStart = (int)(zStart - pCsr->aInput);
  *piEnd = (int)(zEnd - pCsr->aInput);
  *piPos = pCsr->iToken++;
  return SQLITE_OK;
}